

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O0

void HTS_SStreamSet_clear(HTS_SStreamSet *sss)

{
  HTS_SStream *pHVar1;
  HTS_SStreamSet *in_RDI;
  HTS_SStream *sst;
  size_t j;
  size_t i;
  ulong local_18;
  ulong local_10;
  
  if (in_RDI->sstream != (HTS_SStream *)0x0) {
    for (local_10 = 0; local_10 < in_RDI->nstream; local_10 = local_10 + 1) {
      pHVar1 = in_RDI->sstream;
      for (local_18 = 0; local_18 < in_RDI->total_state; local_18 = local_18 + 1) {
        HTS_free((void *)0x10adeb);
        HTS_free((void *)0x10ae02);
      }
      if (pHVar1[local_10].msd != (double *)0x0) {
        HTS_free((void *)0x10ae2c);
      }
      HTS_free((void *)0x10ae3a);
      HTS_free((void *)0x10ae48);
      for (local_18 = 0; local_18 < pHVar1[local_10].win_size; local_18 = local_18 + 1) {
        pHVar1[local_10].win_coefficient[local_18] =
             pHVar1[local_10].win_coefficient[local_18] + pHVar1[local_10].win_l_width[local_18];
        HTS_free((void *)0x10aea9);
      }
      HTS_free((void *)0x10aec7);
      HTS_free((void *)0x10aed5);
      HTS_free((void *)0x10aee3);
      if (pHVar1[local_10].gv_mean != (double *)0x0) {
        HTS_free((void *)0x10aefd);
      }
      if (pHVar1[local_10].gv_vari != (double *)0x0) {
        HTS_free((void *)0x10af17);
      }
      if (pHVar1[local_10].gv_switch != (HTS_Boolean *)0x0) {
        HTS_free((void *)0x10af31);
      }
    }
    HTS_free((void *)0x10af53);
  }
  if (in_RDI->duration != (size_t *)0x0) {
    HTS_free((void *)0x10af6d);
  }
  HTS_SStreamSet_initialize(in_RDI);
  return;
}

Assistant:

void HTS_SStreamSet_clear(HTS_SStreamSet * sss)
{
   size_t i, j;
   HTS_SStream *sst;

   if (sss->sstream) {
      for (i = 0; i < sss->nstream; i++) {
         sst = &sss->sstream[i];
         for (j = 0; j < sss->total_state; j++) {
            HTS_free(sst->mean[j]);
            HTS_free(sst->vari[j]);
         }
         if (sst->msd)
            HTS_free(sst->msd);
         HTS_free(sst->mean);
         HTS_free(sst->vari);
         for (j = 0; j < sst->win_size; j++) {
            sst->win_coefficient[j] += sst->win_l_width[j];
            HTS_free(sst->win_coefficient[j]);
         }
         HTS_free(sst->win_coefficient);
         HTS_free(sst->win_l_width);
         HTS_free(sst->win_r_width);
         if (sst->gv_mean)
            HTS_free(sst->gv_mean);
         if (sst->gv_vari)
            HTS_free(sst->gv_vari);
         if (sst->gv_switch)
            HTS_free(sst->gv_switch);
      }
      HTS_free(sss->sstream);
   }
   if (sss->duration)
      HTS_free(sss->duration);

   HTS_SStreamSet_initialize(sss);
}